

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  size_t *this_00;
  key_type kVar1;
  bool bVar2;
  Syntax syntax;
  int iVar3;
  int iVar4;
  Type TVar5;
  char *value;
  size_type sVar6;
  FileDescriptor *pFVar7;
  string *psVar8;
  ulong uVar9;
  FileOptions *options;
  DescriptorPool *pool;
  EnumDescriptor *this_01;
  FieldDescriptor *pFVar10;
  size_type sVar11;
  Descriptor *pDVar12;
  ServiceDescriptor *this_02;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::Descriptor_*>,_bool> pVar13;
  SubstituteArg local_ee0;
  SubstituteArg local_eb0;
  SubstituteArg local_e80;
  SubstituteArg local_e50;
  SubstituteArg local_e20;
  SubstituteArg local_df0;
  SubstituteArg local_dc0;
  SubstituteArg local_d90;
  SubstituteArg local_d60;
  SubstituteArg local_d30;
  int local_cfc;
  Descriptor *pDStack_cf8;
  int i_5;
  Descriptor *containing_type;
  Descriptor *pDStack_ce8;
  int i_4;
  int local_cdc;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_cd8;
  int i_3;
  undefined1 local_cd0;
  Descriptor *local_cc8;
  int local_cbc;
  undefined1 local_cb8 [4];
  int i_2;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  undefined1 local_c80 [4];
  int i_1;
  SubstituteArg local_c50;
  SubstituteArg local_c20;
  SubstituteArg local_bf0;
  SubstituteArg local_bc0;
  SubstituteArg local_b90;
  SubstituteArg local_b60;
  SubstituteArg local_b30;
  SubstituteArg local_b00;
  SubstituteArg local_ad0;
  allocator local_a99;
  string local_a98;
  undefined1 local_a78 [8];
  SourceLocationCommentPrinter package_comment;
  undefined1 local_9d8 [8];
  vector<int,_std::allocator<int>_> path_1;
  SubstituteArg local_990;
  SubstituteArg local_960;
  SubstituteArg local_930;
  SubstituteArg local_900;
  SubstituteArg local_8d0;
  SubstituteArg local_8a0;
  SubstituteArg local_870;
  SubstituteArg local_840;
  SubstituteArg local_810;
  SubstituteArg local_7e0;
  SubstituteArg local_7b0;
  SubstituteArg local_780;
  SubstituteArg local_750;
  SubstituteArg local_720;
  SubstituteArg local_6f0;
  SubstituteArg local_6c0;
  SubstituteArg local_690;
  SubstituteArg local_660;
  SubstituteArg local_630;
  SubstituteArg local_600;
  SubstituteArg local_5d0;
  SubstituteArg local_5a0;
  SubstituteArg local_570;
  SubstituteArg local_540;
  SubstituteArg local_510;
  SubstituteArg local_4e0;
  SubstituteArg local_4b0;
  SubstituteArg local_480;
  SubstituteArg local_450;
  key_type local_41c;
  undefined1 local_418 [4];
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  string local_3b0;
  undefined1 local_390 [8];
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  allocator local_111;
  string local_110;
  undefined1 local_f0 [8];
  SourceLocationCommentPrinter syntax_comment;
  value_type_conflict local_44;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> path;
  DebugStringOptions *debug_string_options_local;
  FileDescriptor *this_local;
  string *contents;
  
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  local_44 = 0xc;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,&local_44);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"",&local_111);
  anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f0,this,
             (vector<int,_std::allocator<int>_> *)local_40,&local_110,debug_string_options);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f0,__return_storage_ptr__);
  syntax = FileDescriptor::syntax(this);
  value = SyntaxName(syntax);
  strings::internal::SubstituteArg::SubstituteArg(&local_148,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_178);
  strings::internal::SubstituteArg::SubstituteArg(&local_1a8);
  strings::internal::SubstituteArg::SubstituteArg(&local_1d8);
  strings::internal::SubstituteArg::SubstituteArg(&local_208);
  strings::internal::SubstituteArg::SubstituteArg(&local_238);
  strings::internal::SubstituteArg::SubstituteArg(&local_268);
  strings::internal::SubstituteArg::SubstituteArg(&local_298);
  strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
  strings::internal::SubstituteArg::SubstituteArg
            ((SubstituteArg *)((long)&comment_printer.prefix_.field_2 + 8));
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"syntax = \"$0\";\n\n",&local_148,&local_178,&local_1a8,
             &local_1d8,&local_208,&local_238,&local_268,&local_298,&local_2c8,
             (SubstituteArg *)((long)&comment_printer.prefix_.field_2 + 8));
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f0,__return_storage_ptr__);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3b0,"",
             (allocator *)
             ((long)&public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::FileDescriptor>
            ((SourceLocationCommentPrinter *)local_390,this,&local_3b0,debug_string_options);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_390,__return_storage_ptr__);
  this_00 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_418);
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,std::less<int>,std::allocator<int>> *)this_00,*(int **)(this + 0x48),
             *(int **)(this + 0x48) + *(int *)(this + 0x24));
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,std::less<int>,std::allocator<int>> *)local_418,*(int **)(this + 0x50),
             *(int **)(this + 0x50) + *(int *)(this + 0x28));
  for (local_41c = 0; kVar1 = local_41c, iVar3 = dependency_count(this), kVar1 < iVar3;
      local_41c = local_41c + 1) {
    sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &local_41c);
    if (sVar6 == 0) {
      sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_418,&local_41c);
      if (sVar6 == 0) {
        pFVar7 = dependency(this,local_41c);
        psVar8 = name_abi_cxx11_(pFVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_810,psVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_840);
        strings::internal::SubstituteArg::SubstituteArg(&local_870);
        strings::internal::SubstituteArg::SubstituteArg(&local_8a0);
        strings::internal::SubstituteArg::SubstituteArg(&local_8d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_900);
        strings::internal::SubstituteArg::SubstituteArg(&local_930);
        strings::internal::SubstituteArg::SubstituteArg(&local_960);
        strings::internal::SubstituteArg::SubstituteArg(&local_990);
        strings::internal::SubstituteArg::SubstituteArg
                  ((SubstituteArg *)
                   &path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import \"$0\";\n",&local_810,&local_840,&local_870,
                   &local_8a0,&local_8d0,&local_900,&local_930,&local_960,&local_990,
                   (SubstituteArg *)
                   &path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pFVar7 = dependency(this,local_41c);
        psVar8 = name_abi_cxx11_(pFVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_630,psVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_660);
        strings::internal::SubstituteArg::SubstituteArg(&local_690);
        strings::internal::SubstituteArg::SubstituteArg(&local_6c0);
        strings::internal::SubstituteArg::SubstituteArg(&local_6f0);
        strings::internal::SubstituteArg::SubstituteArg(&local_720);
        strings::internal::SubstituteArg::SubstituteArg(&local_750);
        strings::internal::SubstituteArg::SubstituteArg(&local_780);
        strings::internal::SubstituteArg::SubstituteArg(&local_7b0);
        strings::internal::SubstituteArg::SubstituteArg(&local_7e0);
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import weak \"$0\";\n",&local_630,&local_660,&local_690,
                   &local_6c0,&local_6f0,&local_720,&local_750,&local_780,&local_7b0,&local_7e0);
      }
    }
    else {
      pFVar7 = dependency(this,local_41c);
      psVar8 = name_abi_cxx11_(pFVar7);
      strings::internal::SubstituteArg::SubstituteArg(&local_450,psVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_480);
      strings::internal::SubstituteArg::SubstituteArg(&local_4b0);
      strings::internal::SubstituteArg::SubstituteArg(&local_4e0);
      strings::internal::SubstituteArg::SubstituteArg(&local_510);
      strings::internal::SubstituteArg::SubstituteArg(&local_540);
      strings::internal::SubstituteArg::SubstituteArg(&local_570);
      strings::internal::SubstituteArg::SubstituteArg(&local_5a0);
      strings::internal::SubstituteArg::SubstituteArg(&local_5d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_600);
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"import public \"$0\";\n",&local_450,&local_480,&local_4b0,
                 &local_4e0,&local_510,&local_540,&local_570,&local_5a0,&local_5d0,&local_600);
    }
  }
  package_abi_cxx11_(this);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_9d8);
    package_comment.prefix_.field_2._12_4_ = 2;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_9d8,
               (value_type_conflict *)(package_comment.prefix_.field_2._M_local_buf + 0xc));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a98,"",&local_a99);
    anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_a78,this,
               (vector<int,_std::allocator<int>_> *)local_9d8,&local_a98,debug_string_options);
    std::__cxx11::string::~string((string *)&local_a98);
    std::allocator<char>::~allocator((allocator<char> *)&local_a99);
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_a78,__return_storage_ptr__);
    psVar8 = package_abi_cxx11_(this);
    strings::internal::SubstituteArg::SubstituteArg(&local_ad0,psVar8);
    strings::internal::SubstituteArg::SubstituteArg(&local_b00);
    strings::internal::SubstituteArg::SubstituteArg(&local_b30);
    strings::internal::SubstituteArg::SubstituteArg(&local_b60);
    strings::internal::SubstituteArg::SubstituteArg(&local_b90);
    strings::internal::SubstituteArg::SubstituteArg(&local_bc0);
    strings::internal::SubstituteArg::SubstituteArg(&local_bf0);
    strings::internal::SubstituteArg::SubstituteArg(&local_c20);
    strings::internal::SubstituteArg::SubstituteArg(&local_c50);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_c80);
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",&local_ad0,&local_b00,&local_b30,&local_b60,
               &local_b90,&local_bc0,&local_bf0,&local_c20,&local_c50,(SubstituteArg *)local_c80);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_a78,__return_storage_ptr__);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_a78);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_9d8);
  }
  options = FileDescriptor::options(this);
  pool = FileDescriptor::pool(this);
  bVar2 = anon_unknown_1::FormatLineOptions(0,&options->super_Message,pool,__return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  for (groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      iVar3 = groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
      iVar4 = enum_type_count(this), iVar3 < iVar4;
      groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    this_01 = enum_type(this,groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    EnumDescriptor::DebugString(this_01,0,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         *)local_cb8);
  for (local_cbc = 0; iVar3 = local_cbc, iVar4 = extension_count(this), iVar3 < iVar4;
      local_cbc = local_cbc + 1) {
    pFVar10 = extension(this,local_cbc);
    TVar5 = FieldDescriptor::type(pFVar10);
    if (TVar5 == TYPE_GROUP) {
      pFVar10 = extension(this,local_cbc);
      local_cc8 = FieldDescriptor::message_type(pFVar10);
      pVar13 = std::
               set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         *)local_cb8,&local_cc8);
      _Stack_cd8 = pVar13.first._M_node;
      local_cd0 = pVar13.second;
    }
  }
  for (local_cdc = 0; iVar3 = local_cdc, iVar4 = message_type_count(this), iVar3 < iVar4;
      local_cdc = local_cdc + 1) {
    pDStack_ce8 = message_type(this,local_cdc);
    sVar11 = std::
             set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ::count((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)local_cb8,&stack0xfffffffffffff318);
    if (sVar11 == 0) {
      pDVar12 = message_type(this,local_cdc);
      Descriptor::DebugString(pDVar12,0,__return_storage_ptr__,debug_string_options,true);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  for (containing_type._4_4_ = 0; iVar3 = containing_type._4_4_, iVar4 = service_count(this),
      iVar3 < iVar4; containing_type._4_4_ = containing_type._4_4_ + 1) {
    this_02 = service(this,containing_type._4_4_);
    ServiceDescriptor::DebugString(this_02,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pDStack_cf8 = (Descriptor *)0x0;
  for (local_cfc = 0; iVar3 = local_cfc, iVar4 = extension_count(this), iVar3 < iVar4;
      local_cfc = local_cfc + 1) {
    pFVar10 = extension(this,local_cfc);
    pDVar12 = FieldDescriptor::containing_type(pFVar10);
    if (pDVar12 != pDStack_cf8) {
      if (0 < local_cfc) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pFVar10 = extension(this,local_cfc);
      pDStack_cf8 = FieldDescriptor::containing_type(pFVar10);
      psVar8 = Descriptor::full_name_abi_cxx11_(pDStack_cf8);
      strings::internal::SubstituteArg::SubstituteArg(&local_d30,psVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_d60);
      strings::internal::SubstituteArg::SubstituteArg(&local_d90);
      strings::internal::SubstituteArg::SubstituteArg(&local_dc0);
      strings::internal::SubstituteArg::SubstituteArg(&local_df0);
      strings::internal::SubstituteArg::SubstituteArg(&local_e20);
      strings::internal::SubstituteArg::SubstituteArg(&local_e50);
      strings::internal::SubstituteArg::SubstituteArg(&local_e80);
      strings::internal::SubstituteArg::SubstituteArg(&local_eb0);
      strings::internal::SubstituteArg::SubstituteArg(&local_ee0);
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"extend .$0 {\n",&local_d30,&local_d60,&local_d90,&local_dc0
                 ,&local_df0,&local_e20,&local_e50,&local_e80,&local_eb0,&local_ee0);
    }
    pFVar10 = extension(this,local_cfc);
    FieldDescriptor::DebugString(pFVar10,1,__return_storage_ptr__,debug_string_options);
  }
  iVar3 = extension_count(this);
  if (0 < iVar3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_390,__return_storage_ptr__);
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)local_cb8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_418);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_390);
  if ((path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(this, path, "",
                                                debug_string_options);
    syntax_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                              SyntaxName(syntax()));
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  std::set<int> public_dependencies;
  std::set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(this, path, "",
                                                 debug_string_options);
    package_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  if (FormatLineOptions(0, options(), pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents, debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}